

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest13::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest13 *this,uint n_id)

{
  ostream *poVar1;
  stringstream local_1a8 [8];
  stringstream result_sstream;
  ostream local_198;
  uint local_1c;
  FunctionalTest13 *pFStack_18;
  uint n_id_local;
  FunctionalTest13 *this_local;
  
  local_1c = n_id;
  pFStack_18 = this;
  this_local = (FunctionalTest13 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(&local_198,
                           "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nsubroutine void SubroutineVSType(inout vec4 result);\n\nsubroutine(SubroutineVSType) void SubroutineVS1(inout vec4 result)\n{\n    result += vec4("
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(local_1c + 1) * 0.125);
  poVar1 = std::operator<<(poVar1,
                           ", 0, 0, 0);\n}\nsubroutine(SubroutineVSType) void SubroutineVS2(inout vec4 result)\n{\n    result += vec4("
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)(local_1c + 1) * 0.0125);
  std::operator<<(poVar1,
                  ", 0, 0, 0);\n}\n\nsubroutine uniform SubroutineVSType function;\n\nout VS_DATA\n{\n    vec4 data;\n} out_vs;\n\nout gl_PerVertex { vec4 gl_Position; };\nvoid main()\n{\n    gl_Position = vec4(0, 0, 0, 1);\n    out_vs.data = vec4(0);\n\n    function(out_vs.data);\n\n}\n"
                 );
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest13::getVertexShaderBody(unsigned int n_id)
{
	std::stringstream result_sstream;

	/* Pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n"
					  /* Sub-routine */
					  "subroutine void SubroutineVSType(inout vec4 result);\n"
					  "\n"
					  "subroutine(SubroutineVSType) void SubroutineVS1(inout vec4 result)\n"
					  "{\n"
					  "    result += vec4("
				   << float(n_id + 1) * 0.125f << ", 0, 0, 0);\n"
												  "}\n"
												  "subroutine(SubroutineVSType) void SubroutineVS2(inout vec4 result)\n"
												  "{\n"
												  "    result += vec4("
				   << float(n_id + 1) * 0.0125f << ", 0, 0, 0);\n"
												   "}\n"
												   "\n"
												   "subroutine uniform SubroutineVSType function;\n"
												   "\n"
												   /* Output block */
												   "out VS_DATA\n"
												   "{\n"
												   "    vec4 data;\n"
												   "} out_vs;\n"
												   "\n"
												   "out gl_PerVertex { vec4 gl_Position; };\n"
												   /* main() declaration */
												   "void main()\n"
												   "{\n"
												   "    gl_Position = vec4(0, 0, 0, 1);\n"
												   "    out_vs.data = vec4(0);\n"
												   "\n"
												   "    function(out_vs.data);\n"
												   "\n"
												   "}\n";

	return result_sstream.str();
}